

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall
PieceSquareTableInterpolating::Append
          (PieceSquareTableInterpolating *this,PieceSquareRawTableType *table,
          float fInterpolationFactor)

{
  undefined1 local_128 [8];
  PieceSquareTableBase baseTable;
  float fInterpolationFactor_local;
  PieceSquareRawTableType *table_local;
  PieceSquareTableInterpolating *this_local;
  
  baseTable.m_SourceTable._M_elems[0x3f] = (int)fInterpolationFactor;
  PieceSquareTableBase::PieceSquareTableBase((PieceSquareTableBase *)local_128,table);
  std::vector<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>::push_back
            (&this->m_SourceTables,(value_type *)local_128);
  std::vector<float,_std::allocator<float>_>::push_back
            (&this->m_Phases,(value_type_conflict1 *)(baseTable.m_SourceTable._M_elems + 0x3f));
  return;
}

Assistant:

void Append( const PieceSquareRawTableType &table,
                 const float fInterpolationFactor = 0.0f )
    {
        /* for now, we're order sensitive on this. */
        PieceSquareTableBase baseTable( table );
        m_SourceTables.push_back( baseTable );
        m_Phases.push_back( fInterpolationFactor );
    }